

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubicToricLattice.cpp
# Opt level: O0

int __thiscall
CubicToricLattice::neighbour(CubicToricLattice *this,int vertexIndex,string *direction,int sign)

{
  bool bVar1;
  int iVar2;
  invalid_argument *piVar3;
  int in_ECX;
  cartesian4 cVar4;
  cartesian4 coordinate;
  char *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  cartesian4 *in_stack_ffffffffffffff98;
  Lattice *in_stack_ffffffffffffffa0;
  int iStack_30;
  
  if ((in_ECX != 1) && (in_ECX != -1)) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"Sign must be either 1 or -1.");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff78);
  if (((!bVar1) &&
      (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                               in_stack_ffffffffffffff78), !bVar1)) &&
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              in_stack_ffffffffffffff78), !bVar1)) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar3,"Direction must be one of \'x\', \'y\' or \'z\'.");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  cVar4 = Lattice::indexToCoordinate
                    (in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  iStack_30 = cVar4.w;
  if (iStack_30 != 1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            in_stack_ffffffffffffff78);
    if ((!bVar1) &&
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                in_stack_ffffffffffffff78), !bVar1)) {
      std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      in_stack_ffffffffffffff78);
    }
    iVar2 = Lattice::coordinateToIndex(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    return iVar2;
  }
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar3,"Cubic lattice doesn\'t contain w=0 vertices.");
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int CubicToricLattice::neighbour(const int vertexIndex, const std::string &direction, const int sign)
{
    if (!(sign == 1 || sign == -1))
    {
        throw std::invalid_argument("Sign must be either 1 or -1.");
    }
    if (!(direction == "x" || direction == "y" || direction == "z"))
    {
        throw std::invalid_argument("Direction must be one of 'x', 'y' or 'z'.");
    }
    cartesian4 coordinate;
    coordinate = indexToCoordinate(vertexIndex);
    if (coordinate.w == 1)
    {
        throw std::invalid_argument("Cubic lattice doesn't contain w=0 vertices.");
    }
    else
    {
        if (direction == "x")
        {
            coordinate.x = (l + ((coordinate.x + sign) % l)) % l;
        }
        else if (direction == "y")
        {
            coordinate.y = (l + ((coordinate.y + sign) % l)) % l;
        }
        else if (direction == "z")
        {
            coordinate.z = (l + ((coordinate.z + sign) % l)) % l;
        }
    }
    // std::cerr << coordinate << std::endl;
    return coordinateToIndex(coordinate);
}